

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base.cpp
# Opt level: O3

void rw::Matrix::makeRotation(Matrix *dst,V3d *axis,float32 angle)

{
  undefined4 uVar1;
  undefined4 uVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  
  fVar4 = (float)axis->z;
  fVar3 = ((float)angle * 3.1415927) / 180.0;
  uVar1 = axis->x;
  uVar2 = axis->y;
  fVar5 = fVar4 * fVar4 + (float)uVar1 * (float)uVar1 + (float)uVar2 * (float)uVar2;
  fVar5 = (float)(-(uint)(fVar5 != 0.0) & (uint)(1.0 / SQRT(fVar5)) |
                 ~-(uint)(fVar5 != 0.0) & (uint)fVar5);
  fVar6 = fVar5 * (float)uVar1;
  fVar8 = fVar5 * (float)uVar2;
  fVar5 = fVar5 * fVar4;
  fVar4 = sinf(fVar3);
  fVar3 = cosf(fVar3);
  fVar7 = 1.0 - fVar3;
  (dst->right).x = (float32)(fVar6 * fVar6 * fVar7 + fVar3);
  (dst->right).y = (float32)(fVar6 * fVar8 * fVar7 + fVar4 * fVar5);
  (dst->up).x = (float32)(fVar6 * fVar8 * fVar7 + -(fVar4 * fVar5));
  (dst->up).y = (float32)(fVar8 * fVar8 * fVar7 + fVar3);
  (dst->right).z = (float32)(fVar5 * fVar6 * fVar7 - fVar4 * fVar8);
  (dst->up).z = (float32)(fVar5 * fVar8 * fVar7 + fVar4 * fVar6);
  (dst->at).x = (float32)(fVar5 * fVar6 * fVar7 + fVar4 * fVar8);
  (dst->at).y = (float32)(fVar5 * fVar8 * fVar7 + -(fVar4 * fVar6));
  (dst->at).z = (float32)(fVar5 * fVar5 * fVar7 + fVar3);
  (dst->pos).x = 0.0;
  (dst->pos).y = 0.0;
  (dst->pos).z = 0.0;
  dst->flags = 3;
  return;
}

Assistant:

void
Matrix::makeRotation(Matrix *dst, const V3d *axis, float32 angle)
{
//	V3d v = normalize(*axis);
	float32 len = dot(*axis, *axis);
	if(len != 0.0f) len = 1.0f/sqrtf(len);
	V3d v = rw::scale(*axis, len);
	angle = angle*(float)M_PI/180.0f;
	float32 s = sinf(angle);
	float32 c = cosf(angle);
	float32 t = 1.0f - c;

	dst->right.x = c + v.x*v.x*t;
	dst->right.y = v.x*v.y*t + v.z*s;
	dst->right.z = v.z*v.x*t - v.y*s;
	dst->up.x = v.x*v.y*t - v.z*s;
	dst->up.y = c + v.y*v.y*t;
	dst->up.z = v.y*v.z*t + v.x*s;
	dst->at.x = v.z*v.x*t + v.y*s;
	dst->at.y = v.y*v.z*t - v.x*s;
	dst->at.z = c + v.z*v.z*t;
	dst->pos.x = 0.0;
	dst->pos.y = 0.0;
	dst->pos.z = 0.0;
	dst->flags = TYPEORTHONORMAL;
}